

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ac32c::Av1Config_ReadWriteConfig_Test::TestBody
          (Av1Config_ReadWriteConfig_Test *this)

{
  long lVar1;
  pointer *__ptr;
  long *plVar2;
  SEARCH_METHODS *pSVar3;
  AssertHelper local_78;
  AssertHelper local_70;
  size_t bytes_read;
  AssertionResult gtest_ar;
  uint8_t av1c_buffer [4];
  size_t bytes_written;
  Av1Config av1_config;
  
  av1_config.chroma_subsampling_x = '\0';
  av1_config.chroma_subsampling_y = '\0';
  av1_config.chroma_sample_position = '\0';
  av1_config.initial_presentation_delay_present = '\0';
  av1_config.initial_presentation_delay_minus_one = '\0';
  av1_config.marker = '\0';
  av1_config.version = '\0';
  av1_config.seq_profile = '\0';
  av1_config.seq_level_idx_0 = '\0';
  av1_config.seq_tier_0 = '\0';
  av1_config.high_bitdepth = '\0';
  av1_config.twelve_bit = '\0';
  av1_config.monochrome = '\0';
  bytes_written = 0;
  av1c_buffer[0] = '\0';
  av1c_buffer[1] = '\0';
  av1c_buffer[2] = '\0';
  av1c_buffer[3] = '\0';
  bytes_read = bytes_read & 0xffffffff00000000;
  local_78.data_._0_4_ = write_av1config(&av1_config,4,&bytes_written,av1c_buffer);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0",
             "write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written, &av1c_buffer[0])",
             (int *)&bytes_read,(int *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&bytes_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar3 = "";
    }
    else {
      pSVar3 = *(SEARCH_METHODS **)
                gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
               ,0x90,(char *)pSVar3);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&bytes_read);
LAB_00426244:
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    plVar2 = (long *)bytes_read;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar,"kAv1cNoConfigObusSize","bytes_written",
               &(anonymous_namespace)::kAv1cNoConfigObusSize,&bytes_written);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&bytes_read);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar3 = "";
      }
      else {
        pSVar3 = *(SEARCH_METHODS **)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                 ,0x91,(char *)pSVar3);
      testing::internal::AssertHelper::operator=(&local_78,(Message *)&bytes_read);
      goto LAB_00426244;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
      testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                ((internal *)&gtest_ar,"kAv1cAllZero[i]","av1c_buffer[i]",
                 (uchar *)((long)&(anonymous_namespace)::kAv1cAllZero + lVar1),av1c_buffer + lVar1);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&bytes_read);
        std::operator<<((ostream *)(bytes_read + 0x10),"Mismatch in output Av1Config at offset=");
        std::ostream::_M_insert<unsigned_long>(bytes_read + 0x10);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar3 = "";
        }
        else {
          pSVar3 = *(SEARCH_METHODS **)
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                   ,0x93,(char *)pSVar3);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&bytes_read);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        plVar2 = (long *)bytes_read;
        goto LAB_004262c7;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
    }
    bytes_read = 0;
    local_78.data_._0_4_ = 0;
    local_70.data_._0_4_ = read_av1config("",4,&bytes_read,&av1_config);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0",
               "read_av1config(&kAv1cAllZero[0], sizeof(kAv1cAllZero), &bytes_read, &av1_config)",
               (int *)&local_78,(int *)&local_70);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_78);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar3 = "";
      }
      else {
        pSVar3 = *(SEARCH_METHODS **)
                  gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                 ,0x9a,(char *)pSVar3);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar,"kAv1cNoConfigObusSize","bytes_read",
                 &(anonymous_namespace)::kAv1cNoConfigObusSize,&bytes_read);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_78);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar3 = "";
        }
        else {
          pSVar3 = *(SEARCH_METHODS **)
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                   ,0x9b,(char *)pSVar3);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        local_78.data_._0_4_ = 0;
        local_70.data_._0_4_ = write_av1config(&av1_config,4,&bytes_written,av1c_buffer);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"0",
                   "write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written, &av1c_buffer[0])"
                   ,(int *)&local_78,(int *)&local_70);
        if (gtest_ar.success_ != false) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          lVar1 = 0;
          while( true ) {
            if (lVar1 == 4) {
              return;
            }
            testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
                      ((internal *)&gtest_ar,"kAv1cAllZero[i]","av1c_buffer[i]",
                       (uchar *)((long)&(anonymous_namespace)::kAv1cAllZero + lVar1),
                       av1c_buffer + lVar1);
            if (gtest_ar.success_ == false) break;
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            lVar1 = lVar1 + 1;
          }
          testing::Message::Message((Message *)&local_78);
          std::operator<<((ostream *)(CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 0x10),
                          "Mismatch in output Av1Config at offset=");
          std::ostream::_M_insert<unsigned_long>
                    (CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 0x10);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pSVar3 = "";
          }
          else {
            pSVar3 = *(SEARCH_METHODS **)
                      gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                     ,0x9f,(char *)pSVar3);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          plVar2 = (long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_);
LAB_004262c7:
          if (plVar2 != (long *)0x0) {
            (**(code **)(*plVar2 + 8))();
          }
          goto LAB_00426264;
        }
        testing::Message::Message((Message *)&local_78);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pSVar3 = "";
        }
        else {
          pSVar3 = *(SEARCH_METHODS **)
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_config_test.cc"
                   ,0x9d,(char *)pSVar3);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      }
    }
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    plVar2 = (long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
LAB_00426264:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Av1Config, ReadWriteConfig) {
  Av1Config av1_config;
  memset(&av1_config, 0, sizeof(av1_config));

  // Test writing out the AV1 config.
  size_t bytes_written = 0;
  uint8_t av1c_buffer[4] = { 0 };
  ASSERT_EQ(0, write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written,
                               &av1c_buffer[0]));
  ASSERT_EQ(kAv1cNoConfigObusSize, bytes_written);
  for (size_t i = 0; i < kAv1cNoConfigObusSize; ++i) {
    ASSERT_EQ(kAv1cAllZero[i], av1c_buffer[i])
        << "Mismatch in output Av1Config at offset=" << i;
  }

  // Test reading the AV1 config.
  size_t bytes_read = 0;
  ASSERT_EQ(0, read_av1config(&kAv1cAllZero[0], sizeof(kAv1cAllZero),
                              &bytes_read, &av1_config));
  ASSERT_EQ(kAv1cNoConfigObusSize, bytes_read);
  ASSERT_EQ(0, write_av1config(&av1_config, sizeof(av1c_buffer), &bytes_written,
                               &av1c_buffer[0]));
  for (size_t i = 0; i < kAv1cNoConfigObusSize; ++i) {
    ASSERT_EQ(kAv1cAllZero[i], av1c_buffer[i])
        << "Mismatch in output Av1Config at offset=" << i;
  }
}